

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::FlagBase::Validate(FlagBase *this,string *shortPrefix,string *longPrefix)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  RequiredError *this_00;
  string local_210;
  EitherFlag local_1f0;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream problem;
  string *longPrefix_local;
  string *shortPrefix_local;
  FlagBase *this_local;
  
  uVar2 = (*(this->super_NamedBase).super_Base._vptr_Base[2])();
  if (((uVar2 & 1) == 0) && (bVar1 = Base::IsRequired((Base *)this), bVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Flag \'");
    Matcher::GetLongOrAny(&local_1f0,&this->matcher);
    EitherFlag::str(&local_1c8,&local_1f0,shortPrefix,longPrefix);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
    std::operator<<(poVar3,"\' is required");
    std::__cxx11::string::~string((string *)&local_1c8);
    EitherFlag::~EitherFlag(&local_1f0);
    this_00 = (RequiredError *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    RequiredError::RequiredError(this_00,&local_210);
    __cxa_throw(this_00,&RequiredError::typeinfo,RequiredError::~RequiredError);
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortPrefix, const std::string &longPrefix) const override
            {
                if (!Matched() && IsRequired())
                {
                        std::ostringstream problem;
                        problem << "Flag '" << matcher.GetLongOrAny().str(shortPrefix, longPrefix) << "' is required";
#ifdef ARGS_NOEXCEPT
                        error = Error::Required;
                        errorMsg = problem.str();
#else
                        throw RequiredError(problem.str());
#endif
                }
            }